

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O3

String * __thiscall
Jinx::Impl::Parser::ParseFunctionNamePart_abi_cxx11_(String *__return_storage_ptr__,Parser *this)

{
  pointer pSVar1;
  size_type sVar2;
  pointer pcVar3;
  Symbol *pSVar4;
  
  if ((this->m_error == false) &&
     (pSVar1 = (this->m_currentSymbol)._M_current,
     pSVar1 != (this->m_symbolList->
               super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl
               .super__Vector_impl_data._M_finish)) {
    sVar2 = (pSVar1->text)._M_string_length;
    if (sVar2 != 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = (pSVar1->text)._M_dataplus._M_p;
      std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>::
      _M_construct<char*>((basic_string<char,std::char_traits<char>,Jinx::Allocator<char>> *)
                          __return_storage_ptr__,pcVar3,pcVar3 + sVar2);
      pSVar4 = (this->m_currentSymbol)._M_current;
      this->m_lastLine = pSVar4->lineNumber;
      (this->m_currentSymbol)._M_current = pSVar4 + 1;
      return __return_storage_ptr__;
    }
    Error<>(this,"Unexpected symbol type when parsing function name");
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  }
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  return __return_storage_ptr__;
}

Assistant:

inline_t String Parser::ParseFunctionNamePart()
	{
		if (m_error || m_currentSymbol == m_symbolList.end())
			return String();
		if (m_currentSymbol->text.empty())
		{
			Error("Unexpected symbol type when parsing function name");
			return String();
		}
		String s = String(m_currentSymbol->text);
		NextSymbol();
		return s;
	}